

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

WirehairResult __thiscall
wirehair::Codec::DecodeFeed(Codec *this,uint32_t block_id,void *block_in,uint block_bytes)

{
  ushort uVar1;
  ushort row_i;
  uint uVar2;
  bool bVar3;
  uint16_t uVar4;
  WirehairResult WVar5;
  uint8_t *__dest;
  
  if (block_in == (void *)0x0) {
    return Wirehair_InvalidInput;
  }
  uVar1 = this->_block_count;
  if (block_id + 1 == (uint)uVar1) {
    if (block_bytes < this->_output_final_bytes) {
      return Wirehair_InvalidInput;
    }
  }
  else if (this->_block_bytes != block_bytes) {
    return Wirehair_InvalidInput;
  }
  if (uVar1 <= block_id) {
    this->_all_original = false;
  }
  row_i = this->_row_count;
  if (row_i < uVar1) {
    bVar3 = OpportunisticPeeling(this,row_i,block_id);
    if (!bVar3) {
      return Wirehair_NeedMore;
    }
    __dest = this->_input_blocks + (uint)row_i * this->_block_bytes;
    if (block_id + 1 == (uint)uVar1) {
      uVar2 = this->_output_final_bytes;
      memcpy(__dest,block_in,(ulong)uVar2);
      memset(__dest + uVar2,0,(ulong)(this->_block_bytes - uVar2));
    }
    else {
      memcpy(__dest,block_in,(ulong)this->_block_bytes);
    }
    uVar4 = this->_row_count + 1;
    this->_row_count = uVar4;
    if (uVar4 != this->_block_count) {
      return Wirehair_NeedMore;
    }
    if (this->_all_original == true) {
      bVar3 = IsAllOriginalData(this);
      if (bVar3) {
        return Wirehair_Success;
      }
      this->_all_original = false;
      return Wirehair_InvalidInput;
    }
    WVar5 = SolveMatrix(this);
  }
  else {
    WVar5 = ResumeSolveMatrix(this,block_id,block_in);
  }
  if (WVar5 == Wirehair_Success) {
    GenerateRecoveryBlocks(this);
  }
  return WVar5;
}

Assistant:

WirehairResult Codec::DecodeFeed(
    const uint32_t block_id,
    const void * GF256_RESTRICT block_in,
    const unsigned block_bytes)
{
    // Validate input
    if (!block_in) {
        return Wirehair_InvalidInput;
    }

    const bool isFinalBlock = ((block_id + 1) == (uint32_t)_block_count);

    // If this is the last block:
    if (isFinalBlock) {
        // Decoder uses _output_final_bytes to store partial bytes
        const uint32_t final_bytes = _output_final_bytes;

        // If the application did not provide enough bytes:
        if (final_bytes > block_bytes) {
            return Wirehair_InvalidInput;
        }
    }
    else {
        // If the application did not provide the right number of bytes:
        if (_block_bytes != block_bytes) {
            return Wirehair_InvalidInput;
        }
    }

#if defined(CAT_ALL_ORIGINAL)
    // If provided a block of non-original data, mark all original as false
    if (block_id >= _block_count) {
        _all_original = false;
    }
#endif

    const uint16_t row_i = _row_count;

    // If at least N rows stored:
    if (row_i >= _block_count)
    {
        // Resume GE from this row
        const WirehairResult result = ResumeSolveMatrix(block_id, block_in);

        if (result == Wirehair_Success) {
            GenerateRecoveryBlocks();
        }

        return result;
    }

    // If opportunistic peeling failed for this row:
    if (!OpportunisticPeeling(row_i, block_id))
    {
        // This means that there was not enough room in the sparse matrix
        // data structure to store the data in this row.  We will need to
        // wait for another row that references different columns in
        // order to continue
        return Wirehair_NeedMore;
    }

    uint8_t * GF256_RESTRICT dest = _input_blocks + _block_bytes * row_i;

    // If this is the last block id:
    if (isFinalBlock)
    {
        const uint32_t final_bytes = _output_final_bytes;

        // Copy the new row data into the input block area
        memcpy(dest, block_in, final_bytes);

        // Pad with zeros
        memset(dest + final_bytes, 0, _block_bytes - final_bytes);
    }
    else
    {
        // Copy the new row data into the input block area
        memcpy(dest, block_in, _block_bytes);
    }

    ++_row_count;
    CAT_DEBUG_ASSERT(_row_count <= _block_count);

    // If not enough blocks yet:
    if (_row_count != _block_count) {
        return Wirehair_NeedMore;
    }

#if defined(CAT_ALL_ORIGINAL)
    // If all original data, return success (common case)
    if (_all_original) {
        // Check input:
        if (!IsAllOriginalData()) {
            // Application violated precondition that all inputs must be unique
            CAT_DEBUG_BREAK();
            _all_original = false;
            return Wirehair_InvalidInput;
        }
        return Wirehair_Success;
    }
#endif

    // Attempt to solve the matrix
    const WirehairResult result = SolveMatrix();

    // If solve was successful (common):
    if (result == Wirehair_Success) {
        GenerateRecoveryBlocks();
    }

    return result;
}